

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ram_list_virtual_mf_adevices.cc
# Opt level: O3

int __thiscall
aliyun::Ram::ListVirtualMFADevices
          (Ram *this,RamListVirtualMFADevicesResponseType *response,RamErrorInfo *error_info)

{
  pointer pcVar1;
  iterator *piVar2;
  bool bVar3;
  int iVar4;
  ArrayIndex AVar5;
  char *pcVar6;
  AliRpcRequest *this_00;
  long *plVar7;
  size_t sVar8;
  Value *pVVar9;
  Value *pVVar10;
  Value *pVVar11;
  size_type *psVar12;
  uint index;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  string local_380;
  Value local_360;
  undefined1 local_348 [32];
  _Alloc_hider local_328;
  size_type local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  _Alloc_hider local_308;
  size_type local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  _Alloc_hider local_2e8;
  size_type local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  _Alloc_hider local_2c8;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  vector<aliyun::RamListVirtualMFADevicesVirtualMFADeviceType,_std::allocator<aliyun::RamListVirtualMFADevicesVirtualMFADeviceType>_>
  *local_2a8;
  long *local_2a0;
  long local_298;
  long local_290 [2];
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar6 = "https";
  }
  local_2a0 = local_290;
  local_2a8 = &response->virtual_mf_adevices;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a0,pcVar6,pcVar6 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_380);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_360);
  piVar2 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar2->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_2a0,local_298 + (long)local_2a0);
  std::__cxx11::string::append((char *)&local_140);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_260.field_2._M_allocated_capacity = *psVar12;
    local_260.field_2._8_8_ = plVar7[3];
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  }
  else {
    local_260.field_2._M_allocated_capacity = *psVar12;
    local_260._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_260._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar2) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar8 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar6,pcVar6 + sVar8);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_360,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"ListVirtualMFADevices","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_348);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_280);
    if (((0 < iVar4) && (local_280._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_280,&local_360,true), bVar3)) {
      if (error_info != (RamErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&local_360,"RequestId");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_360,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_348,pVVar9);
        }
        else {
          local_348._0_8_ = local_348 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_348,anon_var_dwarf_3083ba + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_348);
        pcVar1 = local_348 + 0x10;
        if ((pointer)local_348._0_8_ != pcVar1) {
          operator_delete((void *)local_348._0_8_,CONCAT71(local_348._17_7_,local_348[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_360,"Code");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_360,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_348,pVVar9);
        }
        else {
          local_348._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_348,anon_var_dwarf_3083ba + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_348);
        if ((pointer)local_348._0_8_ != pcVar1) {
          operator_delete((void *)local_348._0_8_,CONCAT71(local_348._17_7_,local_348[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_360,"HostId");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_360,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_348,pVVar9);
        }
        else {
          local_348._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_348,anon_var_dwarf_3083ba + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_348);
        if ((pointer)local_348._0_8_ != pcVar1) {
          operator_delete((void *)local_348._0_8_,CONCAT71(local_348._17_7_,local_348[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_360,"Message");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_360,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_348,pVVar9);
        }
        else {
          local_348._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_348,anon_var_dwarf_3083ba + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_348);
        if ((pointer)local_348._0_8_ != pcVar1) {
          operator_delete((void *)local_348._0_8_,CONCAT71(local_348._17_7_,local_348[0x10]) + 1);
        }
      }
      if (local_2a8 !=
          (vector<aliyun::RamListVirtualMFADevicesVirtualMFADeviceType,_std::allocator<aliyun::RamListVirtualMFADevicesVirtualMFADeviceType>_>
           *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&local_360,"VirtualMFADevices");
        iVar4 = 200;
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_360,"VirtualMFADevices");
          bVar3 = Json::Value::isMember(pVVar9,"VirtualMFADevice");
          if (bVar3) {
            pVVar9 = Json::Value::operator[](&local_360,"VirtualMFADevices");
            pVVar9 = Json::Value::operator[](pVVar9,"VirtualMFADevice");
            bVar3 = Json::Value::isArray(pVVar9);
            if ((bVar3) && (AVar5 = Json::Value::size(pVVar9), AVar5 != 0)) {
              index = 0;
              do {
                local_348._0_8_ = local_348 + 0x10;
                local_348._8_8_ = 0;
                local_348[0x10] = '\0';
                local_328._M_p = (pointer)&local_318;
                local_320 = 0;
                local_318._M_local_buf[0] = '\0';
                local_308._M_p = (pointer)&local_2f8;
                local_300 = 0;
                local_2f8._M_local_buf[0] = '\0';
                local_2e8._M_p = (pointer)&local_2d8;
                local_2e0 = 0;
                local_2d8._M_local_buf[0] = '\0';
                local_2c8._M_p = (pointer)&local_2b8;
                local_2c0 = 0;
                local_2b8._M_local_buf[0] = '\0';
                pVVar10 = Json::Value::operator[](pVVar9,index);
                bVar3 = Json::Value::isMember(pVVar10,"SerialNumber");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"SerialNumber");
                  Json::Value::asString_abi_cxx11_(&local_380,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_380);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_380._M_dataplus._M_p != &local_380.field_2) {
                    operator_delete(local_380._M_dataplus._M_p,
                                    local_380.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar10,"ActivateDate");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"ActivateDate");
                  Json::Value::asString_abi_cxx11_(&local_380,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_2c8,(string *)&local_380);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_380._M_dataplus._M_p != &local_380.field_2) {
                    operator_delete(local_380._M_dataplus._M_p,
                                    local_380.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar10,"User");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar10,"User");
                  bVar3 = Json::Value::isMember(pVVar10,"UserId");
                  if (bVar3) {
                    pVVar11 = Json::Value::operator[](pVVar10,"UserId");
                    Json::Value::asString_abi_cxx11_(&local_380,pVVar11);
                    std::__cxx11::string::operator=((string *)local_348,(string *)&local_380);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_380._M_dataplus._M_p != &local_380.field_2) {
                      operator_delete(local_380._M_dataplus._M_p,
                                      local_380.field_2._M_allocated_capacity + 1);
                    }
                  }
                  bVar3 = Json::Value::isMember(pVVar10,"UserName");
                  if (bVar3) {
                    pVVar11 = Json::Value::operator[](pVVar10,"UserName");
                    Json::Value::asString_abi_cxx11_(&local_380,pVVar11);
                    std::__cxx11::string::operator=((string *)&local_328,(string *)&local_380);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_380._M_dataplus._M_p != &local_380.field_2) {
                      operator_delete(local_380._M_dataplus._M_p,
                                      local_380.field_2._M_allocated_capacity + 1);
                    }
                  }
                  bVar3 = Json::Value::isMember(pVVar10,"DisplayName");
                  if (bVar3) {
                    pVVar10 = Json::Value::operator[](pVVar10,"DisplayName");
                    Json::Value::asString_abi_cxx11_(&local_380,pVVar10);
                    std::__cxx11::string::operator=((string *)&local_308,(string *)&local_380);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_380._M_dataplus._M_p != &local_380.field_2) {
                      operator_delete(local_380._M_dataplus._M_p,
                                      local_380.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                std::
                vector<aliyun::RamListVirtualMFADevicesVirtualMFADeviceType,_std::allocator<aliyun::RamListVirtualMFADevicesVirtualMFADeviceType>_>
                ::push_back(local_2a8,(value_type *)local_348);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_p != &local_2b8) {
                  operator_delete(local_2c8._M_p,
                                  CONCAT71(local_2b8._M_allocated_capacity._1_7_,
                                           local_2b8._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e8._M_p != &local_2d8) {
                  operator_delete(local_2e8._M_p,
                                  CONCAT71(local_2d8._M_allocated_capacity._1_7_,
                                           local_2d8._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_p != &local_2f8) {
                  operator_delete(local_308._M_p,
                                  CONCAT71(local_2f8._M_allocated_capacity._1_7_,
                                           local_2f8._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._M_p != &local_318) {
                  operator_delete(local_328._M_p,
                                  CONCAT71(local_318._M_allocated_capacity._1_7_,
                                           local_318._M_local_buf[0]) + 1);
                }
                if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
                  operator_delete((void *)local_348._0_8_,
                                  CONCAT71(local_348._17_7_,local_348[0x10]) + 1);
                }
                AVar5 = Json::Value::size(pVVar9);
                index = index + 1;
              } while (index < AVar5);
            }
          }
        }
      }
      goto LAB_00158ee6;
    }
    if (error_info == (RamErrorInfo *)0x0) goto LAB_00158ee1;
    pcVar6 = "parse response failed";
  }
  else {
    if (error_info == (RamErrorInfo *)0x0) {
LAB_00158ee1:
      iVar4 = -1;
      goto LAB_00158ee6;
    }
    pcVar6 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar6);
LAB_00158ee6:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_360);
  if (local_2a0 != local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Ram::ListVirtualMFADevices(RamListVirtualMFADevicesResponseType* response,
                       RamErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","ListVirtualMFADevices");
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}